

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

string * __thiscall adios2::profiling::Timer::GetShortUnits_abi_cxx11_(Timer *this)

{
  long in_RSI;
  string *in_RDI;
  string *units;
  
  std::__cxx11::string::string((string *)in_RDI);
  switch(*(undefined4 *)(in_RSI + 0x30)) {
  case 0:
    std::__cxx11::string::operator=((string *)in_RDI,"mus");
    break;
  case 1:
    std::__cxx11::string::operator=((string *)in_RDI,"ms");
    break;
  case 2:
    std::__cxx11::string::operator=((string *)in_RDI,"s");
    break;
  case 3:
    std::__cxx11::string::operator=((string *)in_RDI,"m");
    break;
  case 4:
    std::__cxx11::string::operator=((string *)in_RDI,"h");
  }
  return in_RDI;
}

Assistant:

std::string Timer::GetShortUnits() const noexcept
{
    std::string units;
    switch (m_TimeUnit)
    {
    case TimeUnit::Microseconds:
        units = "mus";
        break;
    case TimeUnit::Milliseconds:
        units = "ms";
        break;
    case TimeUnit::Seconds:
        units = "s";
        break;
    case TimeUnit::Minutes:
        units = "m";
        break;
    case TimeUnit::Hours:
        units = "h";
        break;
    }
    return units;
}